

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_extcomplex_bool
               (lyout *out,int level,lys_module *module,lys_ext_instance_complex *ext,LY_STMT stmt,
               char *true_val,char *false_val,int *content)

{
  char *pcVar1;
  LY_ERR *pLVar2;
  uint8_t *val;
  lyext_substmt *info;
  char *true_val_local;
  lys_ext_instance_complex *plStack_28;
  LY_STMT stmt_local;
  lys_ext_instance_complex *ext_local;
  lys_module *module_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  info = (lyext_substmt *)true_val;
  true_val_local._4_4_ = stmt;
  plStack_28 = ext;
  ext_local = (lys_ext_instance_complex *)module;
  module_local._4_4_ = level;
  plStack_10 = out;
  pcVar1 = (char *)lys_ext_complex_get_substmt(stmt,ext,(lyext_substmt **)&val);
  if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) {
    yin_print_close_parent(plStack_10,content);
    if (*pcVar1 == '\x01') {
      yin_print_substmt(plStack_10,module_local._4_4_,true_val_local._4_4_,'\0',(char *)info,
                        (lys_module *)ext_local,plStack_28->ext,(uint)plStack_28->ext_size);
    }
    else if (*pcVar1 == '\x02') {
      yin_print_substmt(plStack_10,module_local._4_4_,true_val_local._4_4_,'\0',false_val,
                        (lys_module *)ext_local,plStack_28->ext,(uint)plStack_28->ext_size);
    }
    else {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_yin.c"
             ,0x719);
    }
  }
  return;
}

Assistant:

static void
yin_print_extcomplex_bool(struct lyout *out, int level, const struct lys_module *module,
                          struct lys_ext_instance_complex *ext, LY_STMT stmt,
                          const char *true_val, const char *false_val, int *content)
{
    struct lyext_substmt *info;
    uint8_t *val;

    val = lys_ext_complex_get_substmt(stmt, ext, &info);
    if (!val || !(*val)) {
        return;
    }

    yin_print_close_parent(out, content);
    if (*val == 1) {
        yin_print_substmt(out, level, (LYEXT_SUBSTMT)stmt, 0, true_val, module, ext->ext, ext->ext_size);
    } else if (*val == 2) {
        yin_print_substmt(out, level, (LYEXT_SUBSTMT)stmt, 0, false_val, module, ext->ext, ext->ext_size);
    } else {
        LOGINT;
    }
}